

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuUpdate.c
# Opt level: O0

void Fxu_UpdatePairsSort(Fxu_Matrix *p,Fxu_Double *pDouble)

{
  int iVar1;
  Fxu_Pair *local_20;
  Fxu_Pair *pPair;
  Fxu_Double *pDouble_local;
  Fxu_Matrix *p_local;
  
  p->vPairs->nSize = 0;
  for (local_20 = (pDouble->lPairs).pHead; local_20 != (Fxu_Pair *)0x0; local_20 = local_20->pDNext)
  {
    Vec_PtrPush(p->vPairs,local_20);
  }
  if (1 < p->vPairs->nSize) {
    qsort(p->vPairs->pArray,(long)p->vPairs->nSize,8,Fxu_UpdatePairCompare);
    iVar1 = Fxu_UpdatePairCompare
                      ((Fxu_Pair **)p->vPairs->pArray,
                       (Fxu_Pair **)(p->vPairs->pArray + (long)p->vPairs->nSize + -1));
    if (-1 < iVar1) {
      __assert_fail("Fxu_UpdatePairCompare( (Fxu_Pair**)p->vPairs->pArray, (Fxu_Pair**)p->vPairs->pArray + p->vPairs->nSize - 1 ) < 0"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/fxu/fxuUpdate.c"
                    ,0x251,"void Fxu_UpdatePairsSort(Fxu_Matrix *, Fxu_Double *)");
    }
  }
  return;
}

Assistant:

void Fxu_UpdatePairsSort( Fxu_Matrix * p, Fxu_Double * pDouble )
{
    Fxu_Pair * pPair;
    // order the pairs by the first cube to ensure that new literals are added 
    // to the matrix from top to bottom - collect pairs into the array
    p->vPairs->nSize = 0;
    Fxu_DoubleForEachPair( pDouble, pPair )
        Vec_PtrPush( p->vPairs, pPair );
    if ( p->vPairs->nSize < 2 )
        return;
    // sort
    qsort( (void *)p->vPairs->pArray, (size_t)p->vPairs->nSize, sizeof(Fxu_Pair *), 
        (int (*)(const void *, const void *)) Fxu_UpdatePairCompare );
    assert( Fxu_UpdatePairCompare( (Fxu_Pair**)p->vPairs->pArray, (Fxu_Pair**)p->vPairs->pArray + p->vPairs->nSize - 1 ) < 0 );
}